

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O3

bool __thiscall CEObservation::UpdateCoordinates(CEObservation *this)

{
  bool bVar1;
  double dVar2;
  CESkyCoord local_40;
  
  bVar1 = NeedsUpdate(this);
  if (bVar1) {
    (*(this->body_->super_CESkyCoord)._vptr_CESkyCoord[8])
              (&local_40,this->body_,this->date_,this->observer_);
    CESkyCoord::operator=(&this->cached_coords_,&local_40);
    CESkyCoord::~CESkyCoord(&local_40);
    dVar2 = CEDate::operator_cast_to_double(this->date_);
    this->cached_date_ = dVar2;
  }
  return true;
}

Assistant:

bool CEObservation::UpdateCoordinates()
{
    if (NeedsUpdate()) {
        // Get the coordinates and date
        cached_coords_ = body_->ObservedCoords(*date_, *observer_);
        cached_date_   = *date_;
    }
    return true ;
}